

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Gia_ManPrepareLastTwo(Gia_Man_t *pNew,Vec_Int_t *vSuper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Lit;
  int iVar4;
  int iVar5;
  int *piVar6;
  int t_1;
  int t;
  int nSize;
  int *pArray;
  int Level2;
  int Level1;
  int Lit2;
  int Lit1;
  int Stop;
  int k;
  int i;
  Vec_Int_t *vSuper_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Vec_IntSize(vSuper);
  if (iVar1 != 2) {
    if (iVar1 < 3) {
      __assert_fail("nSize > 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalAig.c"
                    ,0xe8,"void Gia_ManPrepareLastTwo(Gia_Man_t *, Vec_Int_t *)");
    }
    iVar2 = Vec_IntEntry(vSuper,iVar1 + -2);
    iVar2 = Abc_Lit2Var(iVar2);
    iVar2 = Gia_ObjLevelId(pNew,iVar2);
    for (Lit2 = iVar1 + -3; -1 < Lit2; Lit2 = Lit2 + -1) {
      iVar3 = Vec_IntEntry(vSuper,Lit2);
      iVar3 = Abc_Lit2Var(iVar3);
      iVar3 = Gia_ObjLevelId(pNew,iVar3);
      if (iVar2 != iVar3) break;
    }
    if (Lit2 != iVar1 + -3) {
      iVar3 = Abc_MaxInt(Lit2,iVar1 + -9);
      iVar2 = iVar1;
      while (Stop = iVar2 + -1, iVar3 < Stop) {
        for (Lit1 = iVar2 + -2; iVar2 = Stop, iVar3 < Lit1; Lit1 = Lit1 + -1) {
          iVar2 = Vec_IntEntry(vSuper,Stop);
          Lit = Vec_IntEntry(vSuper,Lit1);
          iVar4 = Abc_Lit2Var(iVar2);
          iVar5 = Abc_Lit2Var(Lit);
          if ((iVar4 == iVar5) || (iVar2 = Gia_ManHashLookupInt(pNew,iVar2,Lit), iVar2 != 0)) {
            piVar6 = Vec_IntArray(vSuper);
            if (Stop != iVar1 + -1) {
              iVar2 = piVar6[Stop];
              piVar6[Stop] = piVar6[iVar1 + -1];
              piVar6[iVar1 + -1] = iVar2;
            }
            if (Lit1 != iVar1 + -2) {
              iVar2 = piVar6[Lit1];
              piVar6[Lit1] = piVar6[iVar1 + -2];
              piVar6[iVar1 + -2] = iVar2;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_ManPrepareLastTwo( Gia_Man_t * pNew, Vec_Int_t * vSuper )
{
    int i, k, Stop, Lit1, Lit2, Level1, Level2, * pArray;
    int nSize = Vec_IntSize(vSuper);
    if ( nSize == 2 )
        return;
    assert( nSize > 2 );
    Level1 = Gia_ObjLevelId( pNew, Abc_Lit2Var(Vec_IntEntry(vSuper, nSize-2)) );
    // find the first one with Level1
    for ( Stop = nSize-3; Stop >= 0; Stop-- )
    {
        Level2 = Gia_ObjLevelId( pNew, Abc_Lit2Var(Vec_IntEntry(vSuper, Stop)) );
        if ( Level1 != Level2 )
            break;
    }
    if ( Stop == nSize-3 )
        return;
    // avoid worst-case quadratic behavior by looking at the last 8 nodes
    Stop = Abc_MaxInt( Stop, nSize - 9 );
    for ( i = nSize - 1; i > Stop; i-- )
        for ( k = i - 1; k > Stop; k-- )
        {
            Lit1 = Vec_IntEntry(vSuper, i);
            Lit2 = Vec_IntEntry(vSuper, k);
            if ( Abc_Lit2Var(Lit1) != Abc_Lit2Var(Lit2) && !Gia_ManHashLookupInt(pNew, Lit1, Lit2) ) // new node
                continue;
            // move Lit1 to be last and Lit2 to be the one before
            pArray = Vec_IntArray( vSuper );
            if ( i != nSize-1 )
                ABC_SWAP( int, pArray[i], pArray[nSize-1] );
            if ( k != nSize-2 )
                ABC_SWAP( int, pArray[k], pArray[nSize-2] );
        }
}